

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::serialize
          (XMLSchemaDescriptionImpl *this,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  XMLAttDef *local_40;
  XMLAttDef *tempAttDef_1;
  QName *tempQName_1;
  XMLAttDef *pXStack_28;
  int i;
  XMLAttDef *tempAttDef;
  QName *tempQName;
  XSerializeEngine *serEng_local;
  XMLSchemaDescriptionImpl *this_local;
  
  tempQName = (QName *)serEng;
  serEng_local = (XSerializeEngine *)this;
  XMLSchemaDescription::serialize(&this->super_XMLSchemaDescription,serEng);
  bVar1 = XSerializeEngine::isStoring((XSerializeEngine *)tempQName);
  if (bVar1) {
    XSerializeEngine::operator<<((XSerializeEngine *)tempQName,this->fContextType);
    XSerializeEngine::writeString((XSerializeEngine *)tempQName,this->fNamespace,0,false);
    XTemplateSerializer::storeObject(this->fLocationHints,(XSerializeEngine *)tempQName);
    tempAttDef = (XMLAttDef *)this->fTriggeringComponent;
    operator<<((XSerializeEngine *)tempQName,(XSerializable *)tempAttDef);
    tempAttDef = (XMLAttDef *)this->fEnclosingElementName;
    operator<<((XSerializeEngine *)tempQName,(XSerializable *)tempAttDef);
    pXStack_28 = this->fAttributes;
    operator<<((XSerializeEngine *)tempQName,&pXStack_28->super_XSerializable);
  }
  else {
    XSerializeEngine::operator>>((XSerializeEngine *)tempQName,(int *)((long)&tempQName_1 + 4));
    this->fContextType = tempQName_1._4_4_;
    if (this->fNamespace != (XMLCh *)0x0) {
      pMVar2 = XMLGrammarDescription::getMemoryManager((XMLGrammarDescription *)this);
      (*pMVar2->_vptr_MemoryManager[4])(pMVar2,this->fNamespace);
    }
    XSerializeEngine::readString((XSerializeEngine *)tempQName,&this->fNamespace);
    XTemplateSerializer::loadObject(&this->fLocationHints,4,true,(XSerializeEngine *)tempQName);
    xercesc_4_0::operator>>((XSerializeEngine *)tempQName,(QName **)&tempAttDef_1);
    this->fTriggeringComponent = (QName *)tempAttDef_1;
    xercesc_4_0::operator>>((XSerializeEngine *)tempQName,(QName **)&tempAttDef_1);
    this->fEnclosingElementName = (QName *)tempAttDef_1;
    xercesc_4_0::operator>>((XSerializeEngine *)tempQName,&local_40);
    this->fAttributes = local_40;
  }
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::serialize(XSerializeEngine& serEng)
{
    XMLSchemaDescription::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<(int)fContextType;       
        serEng.writeString(fNamespace);

        /***
         * 
         * Serialize RefArrayVectorOf<XMLCh>*               fLocationHints;
         *
         ***/
        XTemplateSerializer::storeObject(fLocationHints, serEng);

        QName* tempQName = (QName*)fTriggeringComponent;
        serEng<<tempQName;
        tempQName = (QName*)fEnclosingElementName;
        serEng<<tempQName;

        XMLAttDef* tempAttDef = (XMLAttDef*)fAttributes;
        serEng<<tempAttDef;
    }

    else
    {
        int i;
        serEng>>i;

        fContextType = (ContextType)i;       

        //the original fNamespace which came from the ctor needs deallocated
        if (fNamespace)
        {
            XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);
        }
        serEng.readString((XMLCh*&)fNamespace);

        /***
         *
         *  Deserialize RefArrayVectorOf<XMLCh>    fLocationHints     
         *
         ***/
        XTemplateSerializer::loadObject(&fLocationHints, 4, true, serEng);

        QName* tempQName;
        serEng>>tempQName;
        fTriggeringComponent = tempQName;

        serEng>>tempQName;
        fEnclosingElementName = tempQName;

        XMLAttDef* tempAttDef;
        serEng>>tempAttDef;
        fAttributes=tempAttDef;

    }

}